

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

double feintrack::bhattacharrya_dist(hist_cont *source,hist_cont *dest)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  pdVar1 = (source->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (source->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = 0.0;
  for (lVar3 = 0; (long)pdVar1 - (long)pdVar2 >> 3 != lVar3; lVar3 = lVar3 + 1) {
    dVar4 = (source->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar3] *
            (dest->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = dVar5 + dVar4;
  }
  return dVar5;
}

Assistant:

double bhattacharrya_dist(const hist_cont& source, const hist_cont& dest)
	{
		double result = 0;
		for (size_t i = 0, stop_i = source.size(); i < stop_i; ++i)
		{
			result += std::sqrt(source[i] * dest[i]);
		}
		return result;
	}